

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

ParameterError file2string(char **bufp,FILE *file)

{
  int iVar1;
  CURLcode CVar2;
  size_t max;
  size_t len;
  size_t sVar3;
  size_t max_00;
  char *pcVar4;
  dynbuf dyn;
  char buffer [4096];
  
  curlx_dyn_init(&dyn,0x400000000);
  if (file != (FILE *)0x0) {
    do {
      pcVar4 = buffer;
      max = fread(pcVar4,1,0x1000,(FILE *)file);
      iVar1 = ferror((FILE *)file);
      if (iVar1 != 0) {
        curlx_dyn_free(&dyn);
        *bufp = (char *)0x0;
        return PARAM_READ_ERROR;
      }
      while (max != 0) {
        len = memcrlf(pcVar4,false,max);
        CVar2 = curlx_dyn_addn(&dyn,pcVar4,len);
        if (CVar2 != CURLE_OK) {
          return PARAM_NO_MEM;
        }
        max_00 = max - len;
        max = 0;
        if (max_00 != 0) {
          sVar3 = memcrlf(pcVar4 + len,true,max_00);
          pcVar4 = pcVar4 + len + sVar3;
          max = max_00 - sVar3;
        }
      }
      iVar1 = feof((FILE *)file);
    } while (iVar1 == 0);
  }
  pcVar4 = curlx_dyn_ptr(&dyn);
  *bufp = pcVar4;
  return PARAM_OK;
}

Assistant:

ParameterError file2string(char **bufp, FILE *file)
{
  struct curlx_dynbuf dyn;
  curlx_dyn_init(&dyn, MAX_FILE2STRING);
  if(file) {
    do {
      char buffer[4096];
      char *ptr;
      size_t nread = fread(buffer, 1, sizeof(buffer), file);
      if(ferror(file)) {
        curlx_dyn_free(&dyn);
        *bufp = NULL;
        return PARAM_READ_ERROR;
      }
      ptr = buffer;
      while(nread) {
        size_t nlen = memcrlf(ptr, FALSE, nread);
        if(curlx_dyn_addn(&dyn, ptr, nlen))
          return PARAM_NO_MEM;
        nread -= nlen;

        if(nread) {
          ptr += nlen;
          nlen = memcrlf(ptr, TRUE, nread);
          ptr += nlen;
          nread -= nlen;
        }
      }
    } while(!feof(file));
  }
  *bufp = curlx_dyn_ptr(&dyn);
  return PARAM_OK;
}